

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int __thiscall CVmObjList::add_val(CVmObjList *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *val)

{
  undefined4 in_stack_00000010;
  
  add_to_list((vm_val_t *)this,result._4_4_,(char *)CONCAT44(self,in_stack_00000010),val);
  return 1;
}

Assistant:

int CVmObjList::add_val(VMG_ vm_val_t *result,
                        vm_obj_id_t self, const vm_val_t *val)
{
    /* 
     *   Use the generic list adder, using my extension as the constant
     *   list.  We store our extension in the general list format required
     *   by the static adder. 
     */
    add_to_list(vmg_ result, self, ext_, val);

    /* handled */
    return TRUE;
}